

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUSettings.cpp
# Opt level: O0

bool __thiscall RTIMUSettings::loadSettings(RTIMUSettings *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  FILE *pFVar4;
  char *pcVar5;
  RTFLOAT local_28c;
  char local_288 [4];
  RTFLOAT ftemp;
  char val [200];
  char local_1b8 [8];
  char key [200];
  char local_e8 [8];
  char buf [200];
  RTIMUSettings *this_local;
  
  setDefaults(this);
  pFVar4 = fopen(this->m_filename,"r");
  this->m_fd = (FILE *)pFVar4;
  if (pFVar4 == (FILE *)0x0) {
    printf("%s","Settings file not found. Using defaults and creating settings file\n");
    fflush(_stdout);
    iVar2 = (*(this->super_RTIMUHal)._vptr_RTIMUHal[3])();
    bVar1 = (byte)iVar2;
  }
  else {
    while (pcVar5 = fgets(local_e8,200,(FILE *)this->m_fd), pcVar5 != (char *)0x0) {
      if (((local_e8[0] != '#') && (local_e8[0] != ' ')) && (local_e8[0] != '\n')) {
        iVar2 = __isoc99_sscanf(local_e8,"%[^=]=%s",local_1b8,local_288);
        if (iVar2 != 2) {
          fprintf(_stderr,"Bad line in settings file: %s\n",local_e8);
          fclose((FILE *)this->m_fd);
          return false;
        }
        iVar2 = strcmp(local_1b8,"IMUType");
        if (iVar2 == 0) {
          iVar2 = atoi(local_288);
          *(int *)&(this->super_RTIMUHal).field_0x1c = iVar2;
        }
        else {
          iVar2 = strcmp(local_1b8,"FusionType");
          if (iVar2 == 0) {
            iVar2 = atoi(local_288);
            this->m_fusionType = iVar2;
          }
          else {
            iVar2 = strcmp(local_1b8,"BusIsI2C");
            if (iVar2 == 0) {
              iVar2 = strcmp(local_288,"true");
              (this->super_RTIMUHal).m_busIsI2C = iVar2 == 0;
            }
            else {
              iVar2 = strcmp(local_1b8,"I2CBus");
              if (iVar2 == 0) {
                iVar2 = atoi(local_288);
                (this->super_RTIMUHal).m_I2CBus = (uchar)iVar2;
              }
              else {
                iVar2 = strcmp(local_1b8,"SPIBus");
                if (iVar2 == 0) {
                  iVar2 = atoi(local_288);
                  (this->super_RTIMUHal).m_SPIBus = (uchar)iVar2;
                }
                else {
                  iVar2 = strcmp(local_1b8,"SPISelect");
                  if (iVar2 == 0) {
                    iVar2 = atoi(local_288);
                    (this->super_RTIMUHal).m_SPISelect = (uchar)iVar2;
                  }
                  else {
                    iVar2 = strcmp(local_1b8,"SPISpeed");
                    if (iVar2 == 0) {
                      uVar3 = atoi(local_288);
                      (this->super_RTIMUHal).m_SPISpeed = uVar3;
                    }
                    else {
                      iVar2 = strcmp(local_1b8,"I2CSlaveAddress");
                      if (iVar2 == 0) {
                        iVar2 = atoi(local_288);
                        this->m_I2CSlaveAddress = (uchar)iVar2;
                      }
                      else {
                        iVar2 = strcmp(local_1b8,"AxisRotation");
                        if (iVar2 == 0) {
                          iVar2 = atoi(local_288);
                          this->m_axisRotation = iVar2;
                        }
                        else {
                          iVar2 = strcmp(local_1b8,"PressureType");
                          if (iVar2 == 0) {
                            iVar2 = atoi(local_288);
                            this->m_pressureType = iVar2;
                          }
                          else {
                            iVar2 = strcmp(local_1b8,"I2CPressureAddress");
                            if (iVar2 == 0) {
                              iVar2 = atoi(local_288);
                              this->m_I2CPressureAddress = (uchar)iVar2;
                            }
                            else {
                              iVar2 = strcmp(local_1b8,"HumidityType");
                              if (iVar2 == 0) {
                                iVar2 = atoi(local_288);
                                this->m_humidityType = iVar2;
                              }
                              else {
                                iVar2 = strcmp(local_1b8,"I2CHumidityAddress");
                                if (iVar2 == 0) {
                                  iVar2 = atoi(local_288);
                                  this->m_I2CHumidityAddress = (uchar)iVar2;
                                }
                                else {
                                  iVar2 = strcmp(local_1b8,"CompassCalValid");
                                  if (iVar2 == 0) {
                                    iVar2 = strcmp(local_288,"true");
                                    this->m_compassCalValid = iVar2 == 0;
                                  }
                                  else {
                                    iVar2 = strcmp(local_1b8,"CompassCalMinX");
                                    if (iVar2 == 0) {
                                      __isoc99_sscanf(local_288,"%f",&local_28c);
                                      RTVector3::setX(&this->m_compassCalMin,local_28c);
                                    }
                                    else {
                                      iVar2 = strcmp(local_1b8,"CompassCalMinY");
                                      if (iVar2 == 0) {
                                        __isoc99_sscanf(local_288,"%f",&local_28c);
                                        RTVector3::setY(&this->m_compassCalMin,local_28c);
                                      }
                                      else {
                                        iVar2 = strcmp(local_1b8,"CompassCalMinZ");
                                        if (iVar2 == 0) {
                                          __isoc99_sscanf(local_288,"%f",&local_28c);
                                          RTVector3::setZ(&this->m_compassCalMin,local_28c);
                                        }
                                        else {
                                          iVar2 = strcmp(local_1b8,"CompassCalMaxX");
                                          if (iVar2 == 0) {
                                            __isoc99_sscanf(local_288,"%f",&local_28c);
                                            RTVector3::setX(&this->m_compassCalMax,local_28c);
                                          }
                                          else {
                                            iVar2 = strcmp(local_1b8,"CompassCalMaxY");
                                            if (iVar2 == 0) {
                                              __isoc99_sscanf(local_288,"%f",&local_28c);
                                              RTVector3::setY(&this->m_compassCalMax,local_28c);
                                            }
                                            else {
                                              iVar2 = strcmp(local_1b8,"CompassCalMaxZ");
                                              if (iVar2 == 0) {
                                                __isoc99_sscanf(local_288,"%f",&local_28c);
                                                RTVector3::setZ(&this->m_compassCalMax,local_28c);
                                              }
                                              else {
                                                iVar2 = strcmp(local_1b8,"compassAdjDeclination");
                                                if (iVar2 == 0) {
                                                  __isoc99_sscanf(local_288,"%f",&local_28c);
                                                  this->m_compassAdjDeclination = local_28c;
                                                }
                                                else {
                                                  iVar2 = strcmp(local_1b8,
                                                                 "compassCalEllipsoidValid");
                                                  if (iVar2 == 0) {
                                                    iVar2 = strcmp(local_288,"true");
                                                    this->m_compassCalEllipsoidValid = iVar2 == 0;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"compassCalOffsetX");
                                                    if (iVar2 == 0) {
                                                      __isoc99_sscanf(local_288,"%f",&local_28c);
                                                      RTVector3::setX(&this->
                                                  m_compassCalEllipsoidOffset,local_28c);
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"compassCalOffsetY");
                                                    if (iVar2 == 0) {
                                                      __isoc99_sscanf(local_288,"%f",&local_28c);
                                                      RTVector3::setY(&this->
                                                  m_compassCalEllipsoidOffset,local_28c);
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"compassCalOffsetZ");
                                                    if (iVar2 == 0) {
                                                      __isoc99_sscanf(local_288,"%f",&local_28c);
                                                      RTVector3::setZ(&this->
                                                  m_compassCalEllipsoidOffset,local_28c);
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"compassCalCorr11");
                                                    if (iVar2 == 0) {
                                                      __isoc99_sscanf(local_288,"%f",&local_28c);
                                                      this->m_compassCalEllipsoidCorr[0][0] =
                                                           local_28c;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,"compassCalCorr12");
                                                      if (iVar2 == 0) {
                                                        __isoc99_sscanf(local_288,"%f",&local_28c);
                                                        this->m_compassCalEllipsoidCorr[0][1] =
                                                             local_28c;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(local_1b8,"compassCalCorr13")
                                                        ;
                                                        if (iVar2 == 0) {
                                                          __isoc99_sscanf(local_288,"%f",&local_28c)
                                                          ;
                                                          this->m_compassCalEllipsoidCorr[0][2] =
                                                               local_28c;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(local_1b8,
                                                                         "compassCalCorr21");
                                                          if (iVar2 == 0) {
                                                            __isoc99_sscanf(local_288,"%f",
                                                                            &local_28c);
                                                            this->m_compassCalEllipsoidCorr[1][0] =
                                                                 local_28c;
                                                          }
                                                          else {
                                                            iVar2 = strcmp(local_1b8,
                                                                           "compassCalCorr22");
                                                            if (iVar2 == 0) {
                                                              __isoc99_sscanf(local_288,"%f",
                                                                              &local_28c);
                                                              this->m_compassCalEllipsoidCorr[1][1]
                                                                   = local_28c;
                                                            }
                                                            else {
                                                              iVar2 = strcmp(local_1b8,
                                                                             "compassCalCorr23");
                                                              if (iVar2 == 0) {
                                                                __isoc99_sscanf(local_288,"%f",
                                                                                &local_28c);
                                                                this->m_compassCalEllipsoidCorr[1]
                                                                [2] = local_28c;
                                                              }
                                                              else {
                                                                iVar2 = strcmp(local_1b8,
                                                                               "compassCalCorr31");
                                                                if (iVar2 == 0) {
                                                                  __isoc99_sscanf(local_288,"%f",
                                                                                  &local_28c);
                                                                  this->m_compassCalEllipsoidCorr[2]
                                                                  [0] = local_28c;
                                                                }
                                                                else {
                                                                  iVar2 = strcmp(local_1b8,
                                                                                 "compassCalCorr32")
                                                                  ;
                                                                  if (iVar2 == 0) {
                                                                    __isoc99_sscanf(local_288,"%f",
                                                                                    &local_28c);
                                                                    this->m_compassCalEllipsoidCorr
                                                                    [2][1] = local_28c;
                                                                  }
                                                                  else {
                                                                    iVar2 = strcmp(local_1b8,
                                                                                                                                                                      
                                                  "compassCalCorr33");
                                                  if (iVar2 == 0) {
                                                    __isoc99_sscanf(local_288,"%f",&local_28c);
                                                    this->m_compassCalEllipsoidCorr[2][2] =
                                                         local_28c;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"AccelCalValid");
                                                    if (iVar2 == 0) {
                                                      iVar2 = strcmp(local_288,"true");
                                                      this->m_accelCalValid = iVar2 == 0;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,"AccelCalMinX");
                                                      if (iVar2 == 0) {
                                                        __isoc99_sscanf(local_288,"%f",&local_28c);
                                                        RTVector3::setX(&this->m_accelCalMin,
                                                                        local_28c);
                                                      }
                                                      else {
                                                        iVar2 = strcmp(local_1b8,"AccelCalMinY");
                                                        if (iVar2 == 0) {
                                                          __isoc99_sscanf(local_288,"%f",&local_28c)
                                                          ;
                                                          RTVector3::setY(&this->m_accelCalMin,
                                                                          local_28c);
                                                        }
                                                        else {
                                                          iVar2 = strcmp(local_1b8,"AccelCalMinZ");
                                                          if (iVar2 == 0) {
                                                            __isoc99_sscanf(local_288,"%f",
                                                                            &local_28c);
                                                            RTVector3::setZ(&this->m_accelCalMin,
                                                                            local_28c);
                                                          }
                                                          else {
                                                            iVar2 = strcmp(local_1b8,"AccelCalMaxX")
                                                            ;
                                                            if (iVar2 == 0) {
                                                              __isoc99_sscanf(local_288,"%f",
                                                                              &local_28c);
                                                              RTVector3::setX(&this->m_accelCalMax,
                                                                              local_28c);
                                                            }
                                                            else {
                                                              iVar2 = strcmp(local_1b8,
                                                                             "AccelCalMaxY");
                                                              if (iVar2 == 0) {
                                                                __isoc99_sscanf(local_288,"%f",
                                                                                &local_28c);
                                                                RTVector3::setY(&this->m_accelCalMax
                                                                                ,local_28c);
                                                              }
                                                              else {
                                                                iVar2 = strcmp(local_1b8,
                                                                               "AccelCalMaxZ");
                                                                if (iVar2 == 0) {
                                                                  __isoc99_sscanf(local_288,"%f",
                                                                                  &local_28c);
                                                                  RTVector3::setZ(&this->
                                                  m_accelCalMax,local_28c);
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"GyroBiasValid");
                                                    if (iVar2 == 0) {
                                                      iVar2 = strcmp(local_288,"true");
                                                      this->m_gyroBiasValid = iVar2 == 0;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,"GyroBiasX");
                                                      if (iVar2 == 0) {
                                                        __isoc99_sscanf(local_288,"%f",&local_28c);
                                                        RTVector3::setX(&this->m_gyroBias,local_28c)
                                                        ;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(local_1b8,"GyroBiasY");
                                                        if (iVar2 == 0) {
                                                          __isoc99_sscanf(local_288,"%f",&local_28c)
                                                          ;
                                                          RTVector3::setY(&this->m_gyroBias,
                                                                          local_28c);
                                                        }
                                                        else {
                                                          iVar2 = strcmp(local_1b8,"GyroBiasZ");
                                                          if (iVar2 == 0) {
                                                            __isoc99_sscanf(local_288,"%f",
                                                                            &local_28c);
                                                            RTVector3::setZ(&this->m_gyroBias,
                                                                            local_28c);
                                                          }
                                                          else {
                                                            iVar2 = strcmp(local_1b8,
                                                                                                                                                      
                                                  "MPU9150GyroAccelSampleRate");
                                                  if (iVar2 == 0) {
                                                    iVar2 = atoi(local_288);
                                                    this->m_MPU9150GyroAccelSampleRate = iVar2;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,
                                                                   "MPU9150CompassSampleRate");
                                                    if (iVar2 == 0) {
                                                      iVar2 = atoi(local_288);
                                                      this->m_MPU9150CompassSampleRate = iVar2;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,"MPU9150GyroAccelLpf"
                                                                    );
                                                      if (iVar2 == 0) {
                                                        iVar2 = atoi(local_288);
                                                        this->m_MPU9150GyroAccelLpf = iVar2;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(local_1b8,"MPU9150GyroFSR");
                                                        if (iVar2 == 0) {
                                                          iVar2 = atoi(local_288);
                                                          this->m_MPU9150GyroFsr = iVar2;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(local_1b8,"MPU9150AccelFSR"
                                                                        );
                                                          if (iVar2 == 0) {
                                                            iVar2 = atoi(local_288);
                                                            this->m_MPU9150AccelFsr = iVar2;
                                                          }
                                                          else {
                                                            iVar2 = strcmp(local_1b8,
                                                                                                                                                      
                                                  "MPU9250GyroAccelSampleRate");
                                                  if (iVar2 == 0) {
                                                    iVar2 = atoi(local_288);
                                                    this->m_MPU9250GyroAccelSampleRate = iVar2;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,
                                                                   "MPU9250CompassSampleRate");
                                                    if (iVar2 == 0) {
                                                      iVar2 = atoi(local_288);
                                                      this->m_MPU9250CompassSampleRate = iVar2;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,"MPU9250GyroLpf");
                                                      if (iVar2 == 0) {
                                                        iVar2 = atoi(local_288);
                                                        this->m_MPU9250GyroLpf = iVar2;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(local_1b8,"MPU9250AccelLpf");
                                                        if (iVar2 == 0) {
                                                          iVar2 = atoi(local_288);
                                                          this->m_MPU9250AccelLpf = iVar2;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(local_1b8,"MPU9250GyroFSR")
                                                          ;
                                                          if (iVar2 == 0) {
                                                            iVar2 = atoi(local_288);
                                                            this->m_MPU9250GyroFsr = iVar2;
                                                          }
                                                          else {
                                                            iVar2 = strcmp(local_1b8,
                                                                           "MPU9250AccelFSR");
                                                            if (iVar2 == 0) {
                                                              iVar2 = atoi(local_288);
                                                              this->m_MPU9250AccelFsr = iVar2;
                                                            }
                                                            else {
                                                              iVar2 = strcmp(local_1b8,
                                                                                                                                                          
                                                  "GD20HM303DGyroSampleRate");
                                                  if (iVar2 == 0) {
                                                    iVar2 = atoi(local_288);
                                                    this->m_GD20HM303DGyroSampleRate = iVar2;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"GD20HM303DGyroFsr");
                                                    if (iVar2 == 0) {
                                                      iVar2 = atoi(local_288);
                                                      this->m_GD20HM303DGyroFsr = iVar2;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,"GD20HM303DGyroHpf");
                                                      if (iVar2 == 0) {
                                                        iVar2 = atoi(local_288);
                                                        this->m_GD20HM303DGyroHpf = iVar2;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(local_1b8,"GD20HM303DGyroBW")
                                                        ;
                                                        if (iVar2 == 0) {
                                                          iVar2 = atoi(local_288);
                                                          this->m_GD20HM303DGyroBW = iVar2;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(local_1b8,
                                                                         "GD20HM303DAccelSampleRate"
                                                                        );
                                                          if (iVar2 == 0) {
                                                            iVar2 = atoi(local_288);
                                                            this->m_GD20HM303DAccelSampleRate =
                                                                 iVar2;
                                                          }
                                                          else {
                                                            iVar2 = strcmp(local_1b8,
                                                                           "GD20HM303DAccelFsr");
                                                            if (iVar2 == 0) {
                                                              iVar2 = atoi(local_288);
                                                              this->m_GD20HM303DAccelFsr = iVar2;
                                                            }
                                                            else {
                                                              iVar2 = strcmp(local_1b8,
                                                                             "GD20HM303DAccelLpf");
                                                              if (iVar2 == 0) {
                                                                iVar2 = atoi(local_288);
                                                                this->m_GD20HM303DAccelLpf = iVar2;
                                                              }
                                                              else {
                                                                iVar2 = strcmp(local_1b8,
                                                                                                                                                              
                                                  "GD20HM303DCompassSampleRate");
                                                  if (iVar2 == 0) {
                                                    iVar2 = atoi(local_288);
                                                    this->m_GD20HM303DCompassSampleRate = iVar2;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"GD20HM303DCompassFsr")
                                                    ;
                                                    if (iVar2 == 0) {
                                                      iVar2 = atoi(local_288);
                                                      this->m_GD20HM303DCompassFsr = iVar2;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,
                                                                     "GD20M303DLHCGyroSampleRate");
                                                      if (iVar2 == 0) {
                                                        iVar2 = atoi(local_288);
                                                        this->m_GD20M303DLHCGyroSampleRate = iVar2;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(local_1b8,
                                                                       "GD20M303DLHCGyroFsr");
                                                        if (iVar2 == 0) {
                                                          iVar2 = atoi(local_288);
                                                          this->m_GD20M303DLHCGyroFsr = iVar2;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(local_1b8,
                                                                         "GD20M303DLHCGyroHpf");
                                                          if (iVar2 == 0) {
                                                            iVar2 = atoi(local_288);
                                                            this->m_GD20M303DLHCGyroHpf = iVar2;
                                                          }
                                                          else {
                                                            iVar2 = strcmp(local_1b8,
                                                                           "GD20M303DLHCGyroBW");
                                                            if (iVar2 == 0) {
                                                              iVar2 = atoi(local_288);
                                                              this->m_GD20M303DLHCGyroBW = iVar2;
                                                            }
                                                            else {
                                                              iVar2 = strcmp(local_1b8,
                                                                                                                                                          
                                                  "GD20M303DLHCAccelSampleRate");
                                                  if (iVar2 == 0) {
                                                    iVar2 = atoi(local_288);
                                                    this->m_GD20M303DLHCAccelSampleRate = iVar2;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"GD20M303DLHCAccelFsr")
                                                    ;
                                                    if (iVar2 == 0) {
                                                      iVar2 = atoi(local_288);
                                                      this->m_GD20M303DLHCAccelFsr = iVar2;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,
                                                                     "GD20M303DLHCCompassSampleRate"
                                                                    );
                                                      if (iVar2 == 0) {
                                                        iVar2 = atoi(local_288);
                                                        this->m_GD20M303DLHCCompassSampleRate =
                                                             iVar2;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(local_1b8,
                                                                       "GD20M303DLHCCompassFsr");
                                                        if (iVar2 == 0) {
                                                          iVar2 = atoi(local_288);
                                                          this->m_GD20M303DLHCCompassFsr = iVar2;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(local_1b8,
                                                                                                                                                  
                                                  "GD20HM303DLHCGyroSampleRate");
                                                  if (iVar2 == 0) {
                                                    iVar2 = atoi(local_288);
                                                    this->m_GD20HM303DLHCGyroSampleRate = iVar2;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"GD20HM303DLHCGyroFsr")
                                                    ;
                                                    if (iVar2 == 0) {
                                                      iVar2 = atoi(local_288);
                                                      this->m_GD20HM303DLHCGyroFsr = iVar2;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,
                                                                     "GD20HM303DLHCGyroHpf");
                                                      if (iVar2 == 0) {
                                                        iVar2 = atoi(local_288);
                                                        this->m_GD20HM303DLHCGyroHpf = iVar2;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(local_1b8,
                                                                       "GD20HM303DLHCGyroBW");
                                                        if (iVar2 == 0) {
                                                          iVar2 = atoi(local_288);
                                                          this->m_GD20HM303DLHCGyroBW = iVar2;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(local_1b8,
                                                                                                                                                  
                                                  "GD20HM303DLHCAccelSampleRate");
                                                  if (iVar2 == 0) {
                                                    iVar2 = atoi(local_288);
                                                    this->m_GD20HM303DLHCAccelSampleRate = iVar2;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"GD20HM303DLHCAccelFsr"
                                                                  );
                                                    if (iVar2 == 0) {
                                                      iVar2 = atoi(local_288);
                                                      this->m_GD20HM303DLHCAccelFsr = iVar2;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,
                                                                                                                                          
                                                  "GD20HM303DLHCCompassSampleRate");
                                                  if (iVar2 == 0) {
                                                    iVar2 = atoi(local_288);
                                                    this->m_GD20HM303DLHCCompassSampleRate = iVar2;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,
                                                                   "GD20HM303DLHCCompassFsr");
                                                    if (iVar2 == 0) {
                                                      iVar2 = atoi(local_288);
                                                      this->m_GD20HM303DLHCCompassFsr = iVar2;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,
                                                                     "LSM9DS0GyroSampleRate");
                                                      if (iVar2 == 0) {
                                                        iVar2 = atoi(local_288);
                                                        this->m_LSM9DS0GyroSampleRate = iVar2;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(local_1b8,"LSM9DS0GyroFsr");
                                                        if (iVar2 == 0) {
                                                          iVar2 = atoi(local_288);
                                                          this->m_LSM9DS0GyroFsr = iVar2;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(local_1b8,"LSM9DS0GyroHpf")
                                                          ;
                                                          if (iVar2 == 0) {
                                                            iVar2 = atoi(local_288);
                                                            this->m_LSM9DS0GyroHpf = iVar2;
                                                          }
                                                          else {
                                                            iVar2 = strcmp(local_1b8,"LSM9DS0GyroBW"
                                                                          );
                                                            if (iVar2 == 0) {
                                                              iVar2 = atoi(local_288);
                                                              this->m_LSM9DS0GyroBW = iVar2;
                                                            }
                                                            else {
                                                              iVar2 = strcmp(local_1b8,
                                                                                                                                                          
                                                  "LSM9DS0AccelSampleRate");
                                                  if (iVar2 == 0) {
                                                    iVar2 = atoi(local_288);
                                                    this->m_LSM9DS0AccelSampleRate = iVar2;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"LSM9DS0AccelFsr");
                                                    if (iVar2 == 0) {
                                                      iVar2 = atoi(local_288);
                                                      this->m_LSM9DS0AccelFsr = iVar2;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,"LSM9DS0AccelLpf");
                                                      if (iVar2 == 0) {
                                                        iVar2 = atoi(local_288);
                                                        this->m_LSM9DS0AccelLpf = iVar2;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(local_1b8,
                                                                       "LSM9DS0CompassSampleRate");
                                                        if (iVar2 == 0) {
                                                          iVar2 = atoi(local_288);
                                                          this->m_LSM9DS0CompassSampleRate = iVar2;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(local_1b8,
                                                                         "LSM9DS0CompassFsr");
                                                          if (iVar2 == 0) {
                                                            iVar2 = atoi(local_288);
                                                            this->m_LSM9DS0CompassFsr = iVar2;
                                                          }
                                                          else {
                                                            iVar2 = strcmp(local_1b8,
                                                                           "LSM9DS1GyroSampleRate");
                                                            if (iVar2 == 0) {
                                                              iVar2 = atoi(local_288);
                                                              this->m_LSM9DS1GyroSampleRate = iVar2;
                                                            }
                                                            else {
                                                              iVar2 = strcmp(local_1b8,
                                                                             "LSM9DS1GyroFsr");
                                                              if (iVar2 == 0) {
                                                                iVar2 = atoi(local_288);
                                                                this->m_LSM9DS1GyroFsr = iVar2;
                                                              }
                                                              else {
                                                                iVar2 = strcmp(local_1b8,
                                                                               "LSM9DS1GyroHpf");
                                                                if (iVar2 == 0) {
                                                                  iVar2 = atoi(local_288);
                                                                  this->m_LSM9DS1GyroHpf = iVar2;
                                                                }
                                                                else {
                                                                  iVar2 = strcmp(local_1b8,
                                                                                 "LSM9DS1GyroBW");
                                                                  if (iVar2 == 0) {
                                                                    iVar2 = atoi(local_288);
                                                                    this->m_LSM9DS1GyroBW = iVar2;
                                                                  }
                                                                  else {
                                                                    iVar2 = strcmp(local_1b8,
                                                                                                                                                                      
                                                  "LSM9DS1AccelSampleRate");
                                                  if (iVar2 == 0) {
                                                    iVar2 = atoi(local_288);
                                                    this->m_LSM9DS1AccelSampleRate = iVar2;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"LSM9DS1AccelFsr");
                                                    if (iVar2 == 0) {
                                                      iVar2 = atoi(local_288);
                                                      this->m_LSM9DS1AccelFsr = iVar2;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,"LSM9DS1AccelLpf");
                                                      if (iVar2 == 0) {
                                                        iVar2 = atoi(local_288);
                                                        this->m_LSM9DS1AccelLpf = iVar2;
                                                      }
                                                      else {
                                                        iVar2 = strcmp(local_1b8,
                                                                       "LSM9DS1CompassSampleRate");
                                                        if (iVar2 == 0) {
                                                          iVar2 = atoi(local_288);
                                                          this->m_LSM9DS1CompassSampleRate = iVar2;
                                                        }
                                                        else {
                                                          iVar2 = strcmp(local_1b8,
                                                                         "LSM9DS1CompassFsr");
                                                          if (iVar2 == 0) {
                                                            iVar2 = atoi(local_288);
                                                            this->m_LSM9DS1CompassFsr = iVar2;
                                                          }
                                                          else {
                                                            iVar2 = strcmp(local_1b8,
                                                                           "BMX055GyroSampleRate");
                                                            if (iVar2 == 0) {
                                                              iVar2 = atoi(local_288);
                                                              this->m_BMX055GyroSampleRate = iVar2;
                                                            }
                                                            else {
                                                              iVar2 = strcmp(local_1b8,
                                                                             "BMX055GyroFsr");
                                                              if (iVar2 == 0) {
                                                                iVar2 = atoi(local_288);
                                                                this->m_BMX055GyroFsr = iVar2;
                                                              }
                                                              else {
                                                                iVar2 = strcmp(local_1b8,
                                                                                                                                                              
                                                  "BMX055AccelSampleRate");
                                                  if (iVar2 == 0) {
                                                    iVar2 = atoi(local_288);
                                                    this->m_BMX055AccelSampleRate = iVar2;
                                                  }
                                                  else {
                                                    iVar2 = strcmp(local_1b8,"BMX055AccelFsr");
                                                    if (iVar2 == 0) {
                                                      iVar2 = atoi(local_288);
                                                      this->m_BMX055AccelFsr = iVar2;
                                                    }
                                                    else {
                                                      iVar2 = strcmp(local_1b8,"BMX055MagPreset");
                                                      if (iVar2 == 0) {
                                                        iVar2 = atoi(local_288);
                                                        this->m_BMX055MagPreset = iVar2;
                                                      }
                                                      else {
                                                        fprintf(_stderr,
                                                  "Unrecognized key in settings file: %s\n",local_e8
                                                  );
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    printf("Settings file %s loaded\n",this->m_filename);
    fflush(_stdout);
    fclose((FILE *)this->m_fd);
    iVar2 = (*(this->super_RTIMUHal)._vptr_RTIMUHal[3])();
    bVar1 = (byte)iVar2;
  }
  this_local._7_1_ = (bool)(bVar1 & 1);
  return this_local._7_1_;
}

Assistant:

bool RTIMUSettings::loadSettings()
{
    setDefaults();

    char buf[200];
    char key[200];
    char val[200];
    RTFLOAT ftemp;
    //  check to see if settings file exists

    if (!(m_fd = fopen(m_filename, "r"))) {
        HAL_INFO("Settings file not found. Using defaults and creating settings file\n");
        return saveSettings();
    }

    while (fgets(buf, 200, m_fd)) {
        if ((buf[0] == '#') || (buf[0] == ' ') || (buf[0] == '\n'))
            // just a comment
            continue;

        if (sscanf(buf, "%[^=]=%s", key, val) != 2) {
            HAL_ERROR1("Bad line in settings file: %s\n", buf);
            fclose(m_fd);
            return false;
        }

        //  now decode keys

        //  general config

        if (strcmp(key, RTIMULIB_IMU_TYPE) == 0) {
            m_imuType = atoi(val);
        } else if (strcmp(key, RTIMULIB_FUSION_TYPE) == 0) {
            m_fusionType = atoi(val);
        } else if (strcmp(key, RTIMULIB_BUS_IS_I2C) == 0) {
            m_busIsI2C = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_I2C_BUS) == 0) {
            m_I2CBus = atoi(val);
        } else if (strcmp(key, RTIMULIB_SPI_BUS) == 0) {
            m_SPIBus = atoi(val);
        } else if (strcmp(key, RTIMULIB_SPI_SELECT) == 0) {
            m_SPISelect = atoi(val);
        } else if (strcmp(key, RTIMULIB_SPI_SPEED) == 0) {
            m_SPISpeed = atoi(val);
        } else if (strcmp(key, RTIMULIB_I2C_SLAVEADDRESS) == 0) {
            m_I2CSlaveAddress = atoi(val);
        } else if (strcmp(key, RTIMULIB_AXIS_ROTATION) == 0) {
            m_axisRotation = atoi(val);
        } else if (strcmp(key, RTIMULIB_PRESSURE_TYPE) == 0) {
            m_pressureType = atoi(val);
        } else if (strcmp(key, RTIMULIB_I2C_PRESSUREADDRESS) == 0) {
            m_I2CPressureAddress = atoi(val);
        } else if (strcmp(key, RTIMULIB_HUMIDITY_TYPE) == 0) {
            m_humidityType = atoi(val);
        } else if (strcmp(key, RTIMULIB_I2C_HUMIDITYADDRESS) == 0) {
            m_I2CHumidityAddress = atoi(val);

        // compass calibration and adjustment

        } else if (strcmp(key, RTIMULIB_COMPASSCAL_VALID) == 0) {
            m_compassCalValid = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MINX) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMin.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MINY) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMin.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MINZ) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMin.setZ(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MAXX) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMax.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MAXY) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMax.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_MAXZ) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalMax.setZ(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSADJ_DECLINATION) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassAdjDeclination = ftemp;

        // compass ellipsoid calibration

        } else if (strcmp(key, RTIMULIB_COMPASSCAL_ELLIPSOID_VALID) == 0) {
            m_compassCalEllipsoidValid = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_OFFSET_X) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidOffset.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_OFFSET_Y) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidOffset.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_OFFSET_Z) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidOffset.setZ(ftemp);
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR11) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[0][0] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR12) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[0][1] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR13) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[0][2] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR21) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[1][0] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR22) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[1][1] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR23) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[1][2] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR31) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[2][0] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR32) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[2][1] = ftemp;
        } else if (strcmp(key, RTIMULIB_COMPASSCAL_CORR33) == 0) {
            sscanf(val, "%f", &ftemp);
            m_compassCalEllipsoidCorr[2][2] = ftemp;

        // accel calibration

        } else if (strcmp(key, RTIMULIB_ACCELCAL_VALID) == 0) {
            m_accelCalValid = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MINX) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMin.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MINY) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMin.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MINZ) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMin.setZ(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MAXX) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMax.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MAXY) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMax.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_ACCELCAL_MAXZ) == 0) {
            sscanf(val, "%f", &ftemp);
            m_accelCalMax.setZ(ftemp);

            // gyro bias

        } else if (strcmp(key, RTIMULIB_GYRO_BIAS_VALID) == 0) {
            m_gyroBiasValid = strcmp(val, "true") == 0;
        } else if (strcmp(key, RTIMULIB_GYRO_BIAS_X) == 0) {
            sscanf(val, "%f", &ftemp);
            m_gyroBias.setX(ftemp);
        } else if (strcmp(key, RTIMULIB_GYRO_BIAS_Y) == 0) {
            sscanf(val, "%f", &ftemp);
            m_gyroBias.setY(ftemp);
        } else if (strcmp(key, RTIMULIB_GYRO_BIAS_Z) == 0) {
            sscanf(val, "%f", &ftemp);
            m_gyroBias.setZ(ftemp);

        //  MPU9150 settings

        } else if (strcmp(key, RTIMULIB_MPU9150_GYROACCEL_SAMPLERATE) == 0) {
            m_MPU9150GyroAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9150_COMPASS_SAMPLERATE) == 0) {
            m_MPU9150CompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9150_GYROACCEL_LPF) == 0) {
            m_MPU9150GyroAccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9150_GYRO_FSR) == 0) {
            m_MPU9150GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9150_ACCEL_FSR) == 0) {
            m_MPU9150AccelFsr = atoi(val);

        //  MPU9250 settings

        } else if (strcmp(key, RTIMULIB_MPU9250_GYROACCEL_SAMPLERATE) == 0) {
            m_MPU9250GyroAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_COMPASS_SAMPLERATE) == 0) {
            m_MPU9250CompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_GYRO_LPF) == 0) {
            m_MPU9250GyroLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_ACCEL_LPF) == 0) {
            m_MPU9250AccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_GYRO_FSR) == 0) {
            m_MPU9250GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_MPU9250_ACCEL_FSR) == 0) {
            m_MPU9250AccelFsr = atoi(val);

        //  GD20HM303D settings

        } else if (strcmp(key, RTIMULIB_GD20HM303D_GYRO_SAMPLERATE) == 0) {
            m_GD20HM303DGyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_GYRO_FSR) == 0) {
            m_GD20HM303DGyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_GYRO_HPF) == 0) {
            m_GD20HM303DGyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_GYRO_BW) == 0) {
            m_GD20HM303DGyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_ACCEL_SAMPLERATE) == 0) {
            m_GD20HM303DAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_ACCEL_FSR) == 0) {
            m_GD20HM303DAccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_ACCEL_LPF) == 0) {
            m_GD20HM303DAccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_COMPASS_SAMPLERATE) == 0) {
            m_GD20HM303DCompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303D_COMPASS_FSR) == 0) {
            m_GD20HM303DCompassFsr = atoi(val);

        //  GD20M303DLHC settings

        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_GYRO_SAMPLERATE) == 0) {
            m_GD20M303DLHCGyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_GYRO_FSR) == 0) {
            m_GD20M303DLHCGyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_GYRO_HPF) == 0) {
            m_GD20M303DLHCGyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_GYRO_BW) == 0) {
            m_GD20M303DLHCGyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_ACCEL_SAMPLERATE) == 0) {
            m_GD20M303DLHCAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_ACCEL_FSR) == 0) {
            m_GD20M303DLHCAccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_COMPASS_SAMPLERATE) == 0) {
            m_GD20M303DLHCCompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20M303DLHC_COMPASS_FSR) == 0) {
            m_GD20M303DLHCCompassFsr = atoi(val);

        //  GD20HM303DLHC settings

         } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_GYRO_SAMPLERATE) == 0) {
            m_GD20HM303DLHCGyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_GYRO_FSR) == 0) {
            m_GD20HM303DLHCGyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_GYRO_HPF) == 0) {
            m_GD20HM303DLHCGyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_GYRO_BW) == 0) {
            m_GD20HM303DLHCGyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_ACCEL_SAMPLERATE) == 0) {
            m_GD20HM303DLHCAccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_ACCEL_FSR) == 0) {
            m_GD20HM303DLHCAccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_COMPASS_SAMPLERATE) == 0) {
            m_GD20HM303DLHCCompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_GD20HM303DLHC_COMPASS_FSR) == 0) {
            m_GD20HM303DLHCCompassFsr = atoi(val);

        //  LSM9DS0 settings

        } else if (strcmp(key, RTIMULIB_LSM9DS0_GYRO_SAMPLERATE) == 0) {
            m_LSM9DS0GyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_GYRO_FSR) == 0) {
            m_LSM9DS0GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_GYRO_HPF) == 0) {
            m_LSM9DS0GyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_GYRO_BW) == 0) {
            m_LSM9DS0GyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_ACCEL_SAMPLERATE) == 0) {
            m_LSM9DS0AccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_ACCEL_FSR) == 0) {
            m_LSM9DS0AccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_ACCEL_LPF) == 0) {
            m_LSM9DS0AccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_COMPASS_SAMPLERATE) == 0) {
            m_LSM9DS0CompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS0_COMPASS_FSR) == 0) {
            m_LSM9DS0CompassFsr = atoi(val);

        //  LSM9DS1 settings

        } else if (strcmp(key, RTIMULIB_LSM9DS1_GYRO_SAMPLERATE) == 0) {
            m_LSM9DS1GyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_GYRO_FSR) == 0) {
            m_LSM9DS1GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_GYRO_HPF) == 0) {
            m_LSM9DS1GyroHpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_GYRO_BW) == 0) {
            m_LSM9DS1GyroBW = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_ACCEL_SAMPLERATE) == 0) {
            m_LSM9DS1AccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_ACCEL_FSR) == 0) {
            m_LSM9DS1AccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_ACCEL_LPF) == 0) {
            m_LSM9DS1AccelLpf = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_COMPASS_SAMPLERATE) == 0) {
            m_LSM9DS1CompassSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_LSM9DS1_COMPASS_FSR) == 0) {
            m_LSM9DS1CompassFsr = atoi(val);

        //  BMX055 settings

        } else if (strcmp(key, RTIMULIB_BMX055_GYRO_SAMPLERATE) == 0) {
            m_BMX055GyroSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_BMX055_GYRO_FSR) == 0) {
            m_BMX055GyroFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_BMX055_ACCEL_SAMPLERATE) == 0) {
            m_BMX055AccelSampleRate = atoi(val);
        } else if (strcmp(key, RTIMULIB_BMX055_ACCEL_FSR) == 0) {
            m_BMX055AccelFsr = atoi(val);
        } else if (strcmp(key, RTIMULIB_BMX055_MAG_PRESET) == 0) {
            m_BMX055MagPreset = atoi(val);

        //  Handle unrecognized key

        } else {
            HAL_ERROR1("Unrecognized key in settings file: %s\n", buf);
        }
    }
    HAL_INFO1("Settings file %s loaded\n", m_filename);
    fclose(m_fd);
    return saveSettings();                                  // make sure settings file is correct and complete
}